

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

void __thiscall Map::convert_global_masks_into_individual(Map *this)

{
  pointer pGVar1;
  pointer ppEVar2;
  ulong uVar3;
  GlobalEntityMaskFlag *flag;
  pointer pGVar4;
  EntityMaskFlag local_40;
  
  pGVar4 = (this->_global_entity_mask_flags).
           super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar1 = (this->_global_entity_mask_flags).
           super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pGVar4 != pGVar1) {
    do {
      uVar3 = (ulong)(byte)(pGVar4->super_Flag).field_0xb;
      ppEVar2 = (this->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (uVar3 < (ulong)((long)(this->_entities).
                                super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3)) {
        do {
          local_40.super_Flag.bit = (pGVar4->super_Flag).bit;
          local_40.super_Flag.byte = (uint16_t)(byte)(pGVar4->super_Flag).byte;
          local_40.super_Flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261e58;
          local_40.super_Flag._11_1_ = 0;
          std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::emplace_back<EntityMaskFlag>
                    (&(ppEVar2[uVar3]->_attrs).mask_flags,&local_40);
          uVar3 = uVar3 + 1;
          ppEVar2 = (this->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar3 < (ulong)((long)(this->_entities).
                                       super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2 >>
                                3));
      }
      pGVar4 = pGVar4 + 1;
    } while (pGVar4 != pGVar1);
  }
  pGVar4 = (this->_key_door_mask_flags).
           super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar1 = (this->_key_door_mask_flags).
           super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pGVar4 != pGVar1) {
    do {
      uVar3 = (ulong)(byte)(pGVar4->super_Flag).field_0xb;
      ppEVar2 = (this->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (uVar3 < (ulong)((long)(this->_entities).
                                super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3)) {
        do {
          local_40.super_Flag.bit = (pGVar4->super_Flag).bit;
          local_40.super_Flag.byte = (uint16_t)(byte)(pGVar4->super_Flag).byte;
          local_40.super_Flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261e58;
          local_40.super_Flag._11_1_ = 0;
          std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::emplace_back<EntityMaskFlag>
                    (&(ppEVar2[uVar3]->_attrs).mask_flags,&local_40);
          uVar3 = uVar3 + 1;
          ppEVar2 = (this->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar3 < (ulong)((long)(this->_entities).
                                       super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2 >>
                                3));
      }
      pGVar4 = pGVar4 + 1;
    } while (pGVar4 != pGVar1);
  }
  pGVar4 = (this->_global_entity_mask_flags).
           super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_global_entity_mask_flags).
      super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar4) {
    (this->_global_entity_mask_flags).
    super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar4;
  }
  pGVar4 = (this->_key_door_mask_flags).
           super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_key_door_mask_flags).
      super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar4) {
    (this->_key_door_mask_flags).
    super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar4;
  }
  return;
}

Assistant:

void Map::convert_global_masks_into_individual()
{
    for(const GlobalEntityMaskFlag& flag : _global_entity_mask_flags)
    {
        for(size_t i=flag.first_entity_id ; i<_entities.size() ; ++i)
            _entities[i]->mask_flags().emplace_back(EntityMaskFlag(false, flag.byte, flag.bit));
    }

    for(const GlobalEntityMaskFlag& flag : _key_door_mask_flags)
    {
        for(size_t i=flag.first_entity_id ; i<_entities.size() ; ++i)
            _entities[i]->mask_flags().emplace_back(EntityMaskFlag(false, flag.byte, flag.bit));
    }

    _global_entity_mask_flags.clear();
    _key_door_mask_flags.clear();
}